

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DPolyDoor::Tick(DPolyDoor *this)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  double in_RAX;
  FPolyObj *this_00;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DAngle local_18;
  
  local_18.Degrees = in_RAX;
  this_00 = PO_GetPolyobj((this->super_DMovePoly).super_DPolyAction.m_PolyObj);
  if (this_00 == (FPolyObj *)0x0) {
    return;
  }
  if (this->m_Tics != 0) {
    iVar4 = this->m_Tics + -1;
    this->m_Tics = iVar4;
    if (iVar4 != 0) {
      return;
    }
    iVar4 = this_00->seqType;
    uVar5 = (uint)this->m_Close;
    goto LAB_004f2123;
  }
  if (this->m_Type == PODOOR_SWING) {
    dVar1 = (this->super_DMovePoly).super_DPolyAction.m_Dist;
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar1 <= 0.0) {
LAB_004f2231:
      dVar1 = (double)CONCAT44(uVar7,uVar6) - ABS((this->super_DMovePoly).super_DPolyAction.m_Speed)
      ;
      (this->super_DMovePoly).super_DPolyAction.m_Dist = dVar1;
      if (0.0 < dVar1) {
        return;
      }
      SN_StopSequence(this_00);
      if (this->m_Close == false) {
        iVar4 = this->m_WaitTics;
        if (-1 < iVar4) {
          (this->super_DMovePoly).super_DPolyAction.m_Dist = this->m_TotalDist;
          this->m_Close = true;
          this->m_Tics = iVar4;
          (this->super_DMovePoly).super_DPolyAction.m_Speed =
               -(this->super_DMovePoly).super_DPolyAction.m_Speed;
          return;
        }
        this_00->bBlocked = true;
      }
      (*(this->super_DMovePoly).super_DPolyAction.super_DThinker.super_DObject._vptr_DObject[4])
                (this);
      return;
    }
    local_18.Degrees = (this->super_DMovePoly).super_DPolyAction.m_Speed;
    bVar3 = FPolyObj::RotatePolyobj(this_00,&local_18,false);
    if (bVar3) {
      dVar1 = (this->super_DMovePoly).super_DPolyAction.m_Dist;
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      goto LAB_004f2231;
    }
    if (this_00->crush != 0) {
      return;
    }
    if (this->m_Close != true) {
      return;
    }
    (this->super_DMovePoly).super_DPolyAction.m_Dist =
         this->m_TotalDist - (this->super_DMovePoly).super_DPolyAction.m_Dist;
    (this->super_DMovePoly).super_DPolyAction.m_Speed =
         -(this->super_DMovePoly).super_DPolyAction.m_Speed;
LAB_004f231a:
    this->m_Close = false;
    iVar4 = this_00->seqType;
    uVar5 = 0;
LAB_004f2123:
    SN_StartSequence(this_00,iVar4,SEQ_DOOR,uVar5,false);
    return;
  }
  if (this->m_Type != PODOOR_SLIDE) {
    return;
  }
  dVar1 = (this->super_DMovePoly).super_DPolyAction.m_Dist;
  uVar6 = SUB84(dVar1,0);
  uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  if (0.0 < dVar1) {
    bVar3 = FPolyObj::MovePolyobj(this_00,&(this->super_DMovePoly).m_Speedv,false);
    if (!bVar3) {
      if (this_00->crush != 0) {
        return;
      }
      if (this->m_Close != true) {
        return;
      }
      (this->super_DMovePoly).super_DPolyAction.m_Dist =
           this->m_TotalDist - (this->super_DMovePoly).super_DPolyAction.m_Dist;
      (this->m_Direction).Degrees = -(this->m_Direction).Degrees;
      uVar5 = *(uint *)((long)&(this->super_DMovePoly).m_Speedv.X + 4);
      uVar6 = *(undefined4 *)&(this->super_DMovePoly).m_Speedv.Y;
      uVar2 = *(uint *)((long)&(this->super_DMovePoly).m_Speedv.Y + 4);
      *(undefined4 *)&(this->super_DMovePoly).m_Speedv.X =
           *(undefined4 *)&(this->super_DMovePoly).m_Speedv.X;
      *(uint *)((long)&(this->super_DMovePoly).m_Speedv.X + 4) = uVar5 ^ 0x80000000;
      *(undefined4 *)&(this->super_DMovePoly).m_Speedv.Y = uVar6;
      *(uint *)((long)&(this->super_DMovePoly).m_Speedv.Y + 4) = uVar2 ^ 0x80000000;
      goto LAB_004f231a;
    }
    dVar1 = (this->super_DMovePoly).super_DPolyAction.m_Dist;
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  dVar1 = (double)CONCAT44(uVar7,uVar6) - ABS((this->super_DMovePoly).super_DPolyAction.m_Speed);
  (this->super_DMovePoly).super_DPolyAction.m_Dist = dVar1;
  if (dVar1 <= 0.0) {
    SN_StopSequence(this_00);
    if (this->m_Close == false) {
      iVar4 = this->m_WaitTics;
      if (-1 < iVar4) {
        (this->super_DMovePoly).super_DPolyAction.m_Dist = this->m_TotalDist;
        this->m_Close = true;
        this->m_Tics = iVar4;
        uVar5 = *(uint *)((long)&(this->m_Direction).Degrees + 4);
        *(undefined4 *)&(this->m_Direction).Degrees = *(undefined4 *)&(this->m_Direction).Degrees;
        *(uint *)((long)&(this->m_Direction).Degrees + 4) = uVar5 ^ 0x80000000;
        uVar5 = *(uint *)((long)&(this->super_DMovePoly).m_Speedv.X + 4);
        dVar1 = (this->super_DMovePoly).m_Speedv.Y;
        *(undefined4 *)&(this->super_DMovePoly).m_Speedv.X =
             *(undefined4 *)&(this->super_DMovePoly).m_Speedv.X;
        *(uint *)((long)&(this->super_DMovePoly).m_Speedv.X + 4) = uVar5 ^ 0x80000000;
        *(int *)&(this->super_DMovePoly).m_Speedv.Y = SUB84(dVar1,0);
        *(uint *)((long)&(this->super_DMovePoly).m_Speedv.Y + 4) =
             (uint)((ulong)dVar1 >> 0x20) ^ 0x80000000;
        goto LAB_004f234e;
      }
      this_00->bBlocked = true;
    }
    (*(this->super_DMovePoly).super_DPolyAction.super_DThinker.super_DObject._vptr_DObject[4])(this)
    ;
  }
LAB_004f234e:
  FPolyObj::UpdateLinks(this_00);
  return;
}

Assistant:

void DPolyDoor::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly == NULL) return;

	if (m_Tics)
	{
		if (!--m_Tics)
		{
			SN_StartSequence (poly, poly->seqType, SEQ_DOOR, m_Close);
		}
		return;
	}
	switch (m_Type)
	{
	case PODOOR_SLIDE:
		if (m_Dist <= 0 || poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				if (!m_Close && m_WaitTics >= 0)
				{
					m_Dist = m_TotalDist;
					m_Close = true;
					m_Tics = m_WaitTics;
					m_Direction = -m_Direction;
					m_Speedv = -m_Speedv;
				}
				else
				{
					// if set to wait infinitely, Hexen kept the dead thinker to block the polyobject from getting activated again but that causes some problems
					// with the subsectorlinks and the interpolation. Better delete the thinker and use a different means to block it.
					if (!m_Close) poly->bBlocked = true;
					Destroy ();
				}
			}
			poly->UpdateLinks();
		}
		else
		{
			if (poly->crush || !m_Close)
			{ // continue moving if the poly is a crusher, or is opening
				return;
			}
			else
			{ // open back up
				m_Dist = m_TotalDist - m_Dist;
				m_Direction = -m_Direction;
				m_Speedv = -m_Speedv;
				m_Close = false;
				SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			}
		}
		break;

	case PODOOR_SWING:
		if (m_Dist <= 0 || poly->RotatePolyobj (m_Speed))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				if (!m_Close && m_WaitTics >= 0)
				{
					m_Dist = m_TotalDist;
					m_Close = true;
					m_Tics = m_WaitTics;
					m_Speed = -m_Speed;
				}
				else
				{
					if (!m_Close) poly->bBlocked = true;
					Destroy ();
				}
			}
		}
		else
		{
			if(poly->crush || !m_Close)
			{ // continue moving if the poly is a crusher, or is opening
				return;
			}
			else
			{ // open back up and rewait
				m_Dist = m_TotalDist - m_Dist;
				m_Speed = -m_Speed;
				m_Close = false;
				SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
			}
		}			
		break;

	default:
		break;
	}
}